

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O2

int transcode(int K,int symSize,string *inputFname,string *outputFname,string *inputEsiStr,
             string *outputEsiStr)

{
  uint32_t uVar1;
  ulong uVar2;
  size_t __size;
  size_t sVar3;
  int i;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  undefined8 uVar9;
  long *plVar10;
  string *psVar11;
  char *__format;
  int iVar12;
  long lVar13;
  uint32_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uStack_540;
  long local_538;
  ofstream ofs;
  byte abStack_518 [480];
  long local_338;
  ifstream ifs;
  byte abStack_318 [488];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  size_t local_b0;
  size_t interWorkSize;
  size_t interProgSize;
  size_t iblockSymCnt;
  size_t outWorkSize;
  undefined1 *local_88;
  size_t local_80;
  size_t outProgSize;
  ulong local_70;
  string *local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  local_60 = CONCAT44(local_60._4_4_,symSize);
  local_58 = CONCAT44(local_58._4_4_,K);
  uStack_540 = 0x1027e1;
  local_68 = outputEsiStr;
  std::ifstream::ifstream(&local_338,(string *)inputFname,_S_bin|_S_ate);
  uStack_540 = 0x1027e9;
  outWorkSize = std::istream::tellg();
  uStack_540 = 0x102800;
  std::istream::seekg((long)&local_338,_S_beg);
  uStack_540 = 0x102812;
  std::ofstream::ofstream(&local_538,(string *)outputFname,_S_bin);
  if ((abStack_318[*(long *)(local_338 + -0x18)] & 5) == 0) {
    if ((abStack_518[*(long *)(local_538 + -0x18)] & 5) == 0) {
      uStack_540 = 0x102853;
      std::__cxx11::string::string((string *)&local_130,(string *)inputEsiStr);
      uStack_540 = 0x10285f;
      uVar4 = getESICnt(&local_130);
      uStack_540 = 0x10286d;
      std::__cxx11::string::~string((string *)&local_130);
      local_70 = (ulong)(uVar4 * (int)local_60);
      lVar17 = (long)&local_538 - (local_70 + 0xf & 0xfffffffffffffff0);
      puVar14 = (uint32_t *)(lVar17 - ((ulong)uVar4 * 4 + 0xf & 0xfffffffffffffff0));
      local_88 = (undefined1 *)&local_538;
      puVar14[-2] = 0x1028b2;
      puVar14[-1] = 0;
      std::__cxx11::string::string((string *)&local_110,(string *)inputEsiStr);
      puVar14[-2] = 0x1028c1;
      puVar14[-1] = 0;
      parseESIStr(&local_110,(int)inputEsiStr,puVar14);
      puVar14[-2] = 0x1028cd;
      puVar14[-1] = 0;
      std::__cxx11::string::~string((string *)&local_110);
      uVar16 = local_58 & 0xffffffff;
      iVar12 = uVar4 - (int)local_58;
      puVar14[-2] = 0x1028f3;
      puVar14[-1] = 0;
      uVar5 = RqInterGetMemSizes(uVar16,iVar12,&local_b0,&interWorkSize,&interProgSize);
      if (uVar5 == 0) {
        puVar14[-2] = 0x10290a;
        puVar14[-1] = 0;
        pvVar6 = malloc(local_b0);
        uVar16 = local_58 & 0xffffffff;
        local_38 = pvVar6;
        puVar14[-2] = 0x10291f;
        puVar14[-1] = 0;
        uVar5 = RqInterInit(uVar16,iVar12,pvVar6,local_b0);
        if (uVar5 == 0) {
          uVar15 = 0;
          uVar16 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar16 = uVar15;
          }
          puVar14[-2] = 1;
          puVar14[-1] = 0;
          uVar2 = *(ulong *)(puVar14 + -2);
          for (; pvVar6 = local_38, uVar16 != uVar15; uVar15 = uVar15 + 1) {
            uVar1 = puVar14[uVar15];
            puVar14[-2] = 0x10294a;
            puVar14[-1] = 0;
            RqInterAddIds(pvVar6,uVar1,uVar2 & 0xffffffff);
          }
          puVar14[-2] = 0x10295e;
          puVar14[-1] = 0;
          pvVar7 = malloc(interWorkSize);
          pvVar6 = local_38;
          local_40 = pvVar7;
          puVar14[-2] = 0x102971;
          puVar14[-1] = 0;
          uVar4 = RqInterCompile(pvVar6,pvVar7,interWorkSize);
          psVar11 = local_68;
          if (uVar4 == 0) {
            puVar14[-2] = 0x10298c;
            puVar14[-1] = 0;
            std::__cxx11::string::string((string *)&local_f0,(string *)psVar11);
            puVar14[-2] = 0x102998;
            puVar14[-1] = 0;
            uVar4 = getESICnt(&local_f0);
            puVar14[-2] = 0x1029a7;
            puVar14[-1] = 0;
            std::__cxx11::string::~string((string *)&local_f0);
            puVar14 = (uint32_t *)((long)puVar14 - ((ulong)uVar4 * 4 + 0xf & 0xfffffffffffffff0));
            puVar14[-2] = 0x1029ce;
            puVar14[-1] = 0;
            std::__cxx11::string::string((string *)&local_d0,(string *)psVar11);
            puVar14[-2] = 0x1029dd;
            puVar14[-1] = 0;
            parseESIStr(&local_d0,(int)psVar11,puVar14);
            puVar14[-2] = 0x1029e9;
            puVar14[-1] = 0;
            std::__cxx11::string::~string((string *)&local_d0);
            local_68 = (string *)(ulong)(uVar4 * (int)local_60);
            sVar8 = (long)puVar14 -
                    ((ulong)((long)&local_68->_M_string_length + 7U) & 0xfffffffffffffff0);
            outProgSize = sVar8;
            *(undefined8 *)(sVar8 - 8) = 0x102a1c;
            uVar5 = RqOutGetMemSizes(uVar4,&iblockSymCnt,&local_80);
            if (uVar5 == 0) {
              *(undefined8 *)(sVar8 - 8) = 0x102a33;
              pvVar6 = malloc(iblockSymCnt);
              __size = local_80;
              *(undefined8 *)(sVar8 - 8) = 0x102a3f;
              local_48 = malloc(__size);
              uVar16 = local_58 & 0xffffffff;
              local_50 = pvVar6;
              *(undefined8 *)(sVar8 - 8) = 0x102a55;
              uVar5 = RqOutInit(uVar16,pvVar6,iblockSymCnt);
              if (uVar5 == 0) {
                uVar15 = 0;
                uVar16 = (ulong)uVar4;
                if ((int)uVar4 < 1) {
                  uVar16 = uVar15;
                }
                *(undefined8 *)(sVar8 - 8) = 1;
                uVar2 = *(ulong *)(sVar8 - 8);
                do {
                  pvVar7 = local_48;
                  pvVar6 = local_50;
                  if (uVar16 == uVar15) {
                    *(undefined8 *)(sVar8 - 8) = 0x102b0e;
                    uVar4 = RqOutCompile(pvVar6,pvVar7,local_80);
                    if (uVar4 != 0) {
                      iVar12 = 0;
                      *(undefined8 *)(sVar8 - 8) = 0x102efe;
                      fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                              ,0xe0,"RqOutCompile(outWork, outProgram, outProgSize)",(ulong)uVar4);
                      pvVar6 = local_40;
                      *(undefined8 *)(sVar8 - 8) = 0x102f07;
                      free(pvVar6);
                      pvVar6 = local_38;
                      *(undefined8 *)(sVar8 - 8) = 0x102f10;
                      free(pvVar6);
                      pvVar6 = local_50;
                      *(undefined8 *)(sVar8 - 8) = 0x102f19;
                      free(pvVar6);
                      pvVar6 = local_48;
                      *(undefined8 *)(sVar8 - 8) = 0x102f22;
                      free(pvVar6);
                      *(undefined8 *)(sVar8 - 8) = 0x102f2e;
                      std::ifstream::close();
                      *(undefined8 *)(sVar8 - 8) = 0x102f3a;
                      std::ofstream::close();
                      plVar10 = (long *)local_88;
                      goto LAB_00102c69;
                    }
                    local_58 = (ulong)(int)local_60;
                    uVar16 = 0;
                    iVar12 = 0;
                    local_60 = (long)(int)local_70;
                    if (0 < (int)local_70) {
                      uVar16 = local_70 & 0xffffffff;
                      iVar12 = 0;
                    }
                    goto LAB_00102b35;
                  }
                  uVar1 = puVar14[uVar15];
                  *(undefined8 *)(sVar8 - 8) = 0x102a84;
                  uVar4 = RqOutAddIds(pvVar6,uVar1,uVar2 & 0xffffffff);
                  uVar15 = uVar15 + 1;
                } while (uVar4 == 0);
                iVar12 = 0;
                *(undefined8 *)(sVar8 - 8) = 0x102abc;
                fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                        ,0xdf,"RqOutAddIds(outWork, ESIs_wanted[i], 1)",(ulong)uVar4);
                pvVar6 = local_40;
                *(undefined8 *)(sVar8 - 8) = 0x102ac5;
                free(pvVar6);
                pvVar6 = local_38;
                *(undefined8 *)(sVar8 - 8) = 0x102ace;
                free(pvVar6);
                pvVar6 = local_50;
                *(undefined8 *)(sVar8 - 8) = 0x102ad7;
                free(pvVar6);
                pvVar6 = local_48;
                *(undefined8 *)(sVar8 - 8) = 0x102ae0;
                free(pvVar6);
                *(undefined8 *)(sVar8 - 8) = 0x102aec;
                std::ifstream::close();
                *(undefined8 *)(sVar8 - 8) = 0x102af8;
                std::ofstream::close();
                plVar10 = (long *)local_88;
              }
              else {
                iVar12 = 0;
                *(undefined8 *)(sVar8 - 8) = 0x102e8c;
                fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                        ,0xdd,"RqOutInit(K, outWork, outWorkSize)",(ulong)uVar5);
                pvVar6 = local_40;
                *(undefined8 *)(sVar8 - 8) = 0x102e95;
                free(pvVar6);
                pvVar6 = local_38;
                *(undefined8 *)(sVar8 - 8) = 0x102e9e;
                free(pvVar6);
                pvVar6 = local_50;
                *(undefined8 *)(sVar8 - 8) = 0x102ea7;
                free(pvVar6);
                pvVar6 = local_48;
                *(undefined8 *)(sVar8 - 8) = 0x102eb0;
                free(pvVar6);
                *(undefined8 *)(sVar8 - 8) = 0x102ebc;
                std::ifstream::close();
                *(undefined8 *)(sVar8 - 8) = 0x102ec8;
                std::ofstream::close();
                plVar10 = (long *)local_88;
              }
            }
            else {
              iVar12 = 0;
              *(undefined8 *)(sVar8 - 8) = 0x102e2c;
              fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                      ,0xda,"RqOutGetMemSizes(outputEsiCnt, &outWorkSize, &outProgSize)",
                      (ulong)uVar5);
              pvVar6 = local_40;
              *(undefined8 *)(sVar8 - 8) = 0x102e35;
              free(pvVar6);
              pvVar6 = local_38;
              *(undefined8 *)(sVar8 - 8) = 0x102e3e;
              free(pvVar6);
              *(undefined8 *)(sVar8 - 8) = 0x102e4a;
              std::ifstream::close();
              *(undefined8 *)(sVar8 - 8) = 0x102e56;
              std::ofstream::close();
              plVar10 = (long *)local_88;
            }
          }
          else {
            iVar12 = 0;
            puVar14[-2] = 0x102dcc;
            puVar14[-1] = 0;
            fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                    ,0xcf,"RqInterCompile(interWork, interProgram, interProgSize)",(ulong)uVar4);
            pvVar6 = local_40;
            puVar14[-2] = 0x102dd5;
            puVar14[-1] = 0;
            free(pvVar6);
            pvVar6 = local_38;
            puVar14[-2] = 0x102dde;
            puVar14[-1] = 0;
            free(pvVar6);
            puVar14[-2] = 0x102dea;
            puVar14[-1] = 0;
            std::ifstream::close();
            puVar14[-2] = 0x102df6;
            puVar14[-1] = 0;
            std::ofstream::close();
            plVar10 = (long *)local_88;
          }
        }
        else {
          iVar12 = 0;
          puVar14[-2] = 0x102d75;
          puVar14[-1] = 0;
          fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                  ,0xc9,"RqInterInit(K, nExtra, interWork, interWorkSize)",(ulong)uVar5);
          pvVar6 = local_38;
          puVar14[-2] = 0x102d7e;
          puVar14[-1] = 0;
          free(pvVar6);
          puVar14[-2] = 0x102d8a;
          puVar14[-1] = 0;
          std::ifstream::close();
          puVar14[-2] = 0x102d96;
          puVar14[-1] = 0;
          std::ofstream::close();
          plVar10 = (long *)local_88;
        }
      }
      else {
        iVar12 = 0;
        puVar14[-2] = 0x102d27;
        puVar14[-1] = 0;
        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                ,0xc5,"RqInterGetMemSizes(K, nExtra, &interWorkSize, &interProgSize, &iblockSymCnt)"
                ,(ulong)uVar5);
        puVar14[-2] = 0x102d33;
        puVar14[-1] = 0;
        std::ifstream::close();
        puVar14[-2] = 0x102d3f;
        puVar14[-1] = 0;
        std::ofstream::close();
        plVar10 = (long *)local_88;
      }
      goto LAB_00102c69;
    }
    __format = "Error:%s:%d: Unable to open output file\n";
    uVar9 = 0xb0;
  }
  else {
    __format = "Error:%s:%d: Unable to open input file\n";
    uVar9 = 0xa8;
  }
  uStack_540 = 0x102cd6;
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
          ,uVar9);
  uStack_540 = 0x102ce2;
  std::ifstream::close();
  iVar12 = 0;
  uStack_540 = 0x102cf1;
  std::ofstream::close();
  plVar10 = &local_538;
  goto LAB_00102c69;
LAB_00102b35:
  pvVar6 = local_40;
  if ((int)outWorkSize <= iVar12) goto LAB_00102c25;
  for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    *(undefined1 *)(lVar17 + uVar15) = 0;
  }
  *(undefined8 *)(sVar8 - 8) = 0x102b66;
  std::istream::read((char *)&local_338,lVar17);
  pvVar6 = local_40;
  uVar2 = local_58;
  uVar15 = local_70;
  if ((abStack_318[*(long *)(local_338 + -0x18)] & 5) != 0) {
    iVar12 = 0;
    *(undefined8 *)(sVar8 - 8) = 0x102f71;
    fprintf(_stderr,"Error: %s:%d: Unable to read enough bytes from file: %ld\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
            ,0xec,_ifs);
    pvVar6 = local_40;
    *(undefined8 *)(sVar8 - 8) = 0x102f7a;
    free(pvVar6);
    pvVar6 = local_38;
    *(undefined8 *)(sVar8 - 8) = 0x102f83;
    free(pvVar6);
    pvVar6 = local_50;
    *(undefined8 *)(sVar8 - 8) = 0x102f8c;
    free(pvVar6);
    pvVar6 = local_48;
    *(undefined8 *)(sVar8 - 8) = 0x102f95;
    free(pvVar6);
    *(undefined8 *)(sVar8 - 8) = 0x102f9d;
    std::ifstream::close();
    *(undefined8 *)(sVar8 - 8) = 0x102fa9;
    std::ofstream::close();
    plVar10 = (long *)local_88;
    goto LAB_00102c69;
  }
  lVar13 = sVar8 - (interProgSize * local_58 + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)(lVar13 + -8) = 0x102bb5;
  uVar4 = RqInterExecute(pvVar6,uVar2,lVar17,uVar15,lVar13);
  psVar11 = local_68;
  sVar3 = outProgSize;
  if (uVar4 != 0) {
    *(undefined8 *)(lVar13 + -8) = 0x102fdc;
    fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
            ,0xfb,"RqInterExecute(interProgram, symSize, src, sizeof(src), iblock, sizeof(iblock))",
            (ulong)uVar4);
    pvVar6 = local_40;
    *(undefined8 *)(lVar13 + -8) = 0x102fe5;
    free(pvVar6);
    pvVar6 = local_38;
    *(undefined8 *)(lVar13 + -8) = 0x102fee;
    free(pvVar6);
    pvVar6 = local_50;
    *(undefined8 *)(lVar13 + -8) = 0x102ff7;
    free(pvVar6);
    pvVar6 = local_48;
    *(undefined8 *)(lVar13 + -8) = 0x103000;
    free(pvVar6);
    *(undefined8 *)(lVar13 + -8) = 0x10300c;
    std::ifstream::close();
    *(undefined8 *)(lVar13 + -8) = 0x103018;
    std::ofstream::close();
LAB_001030e9:
    iVar12 = 0;
    plVar10 = (long *)local_88;
    goto LAB_00102c69;
  }
  *(undefined8 *)(lVar13 + -8) = 0x102bcc;
  memset((void *)sVar3,0,(size_t)psVar11);
  pvVar6 = local_48;
  uVar15 = local_58;
  psVar11 = local_68;
  sVar3 = outProgSize;
  *(undefined8 *)(lVar13 + -8) = 0x102be4;
  uVar4 = RqOutExecute(pvVar6,uVar15,lVar13,sVar3,psVar11);
  sVar3 = outProgSize;
  if (uVar4 != 0) {
    *(undefined8 *)(lVar13 + -8) = 0x10304b;
    fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
            ,0x103,"RqOutExecute(outProgram, symSize, iblock, enc, sizeof(enc))",(ulong)uVar4);
    pvVar6 = local_40;
    *(undefined8 *)(lVar13 + -8) = 0x103054;
    free(pvVar6);
    pvVar6 = local_38;
    *(undefined8 *)(lVar13 + -8) = 0x10305d;
    free(pvVar6);
    pvVar6 = local_50;
    *(undefined8 *)(lVar13 + -8) = 0x103066;
    free(pvVar6);
    pvVar6 = local_48;
    *(undefined8 *)(lVar13 + -8) = 0x10306f;
    free(pvVar6);
    *(undefined8 *)(lVar13 + -8) = 0x10307b;
    std::ifstream::close();
    *(undefined8 *)(lVar13 + -8) = 0x103087;
    std::ofstream::close();
    goto LAB_001030e9;
  }
  *(undefined8 *)(lVar13 + -8) = 0x102c00;
  std::ostream::write((char *)&local_538,sVar3);
  if (*(int *)(abStack_518 + *(long *)(local_538 + -0x18)) != 0) {
    *(undefined8 *)(lVar13 + -8) = 0x1030ad;
    fprintf(_stderr,"Error:%s:%d: Error while writing to output file\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
            ,0x10b);
    pvVar6 = local_40;
    *(undefined8 *)(lVar13 + -8) = 0x1030b6;
    free(pvVar6);
    pvVar6 = local_38;
    *(undefined8 *)(lVar13 + -8) = 0x1030bf;
    free(pvVar6);
    pvVar6 = local_50;
    *(undefined8 *)(lVar13 + -8) = 0x1030c8;
    free(pvVar6);
    pvVar6 = local_48;
    *(undefined8 *)(lVar13 + -8) = 0x1030d1;
    free(pvVar6);
    *(undefined8 *)(lVar13 + -8) = 0x1030dd;
    std::ifstream::close();
    *(undefined8 *)(lVar13 + -8) = 0x1030e9;
    std::ofstream::close();
    goto LAB_001030e9;
  }
  iVar12 = iVar12 + (int)local_70;
  goto LAB_00102b35;
LAB_00102c25:
  *(undefined8 *)(sVar8 - 8) = 0x102c2e;
  free(pvVar6);
  pvVar6 = local_38;
  *(undefined8 *)(sVar8 - 8) = 0x102c37;
  free(pvVar6);
  pvVar6 = local_50;
  *(undefined8 *)(sVar8 - 8) = 0x102c40;
  free(pvVar6);
  pvVar6 = local_48;
  *(undefined8 *)(sVar8 - 8) = 0x102c49;
  free(pvVar6);
  *(undefined8 *)(sVar8 - 8) = 0x102c55;
  std::ifstream::close();
  *(undefined8 *)(sVar8 - 8) = 1;
  iVar12 = (int)*(undefined8 *)(sVar8 - 8);
  *(undefined8 *)(sVar8 - 8) = 0x102c65;
  std::ofstream::close();
  plVar10 = (long *)local_88;
LAB_00102c69:
  *(undefined8 *)((long)plVar10 + -8) = 0x102c75;
  std::ofstream::~ofstream(&local_538);
  *(undefined8 *)((long)plVar10 + -8) = 0x102c81;
  std::ifstream::~ifstream(&local_338);
  return iVar12;
}

Assistant:

int transcode(int K, int symSize, string inputFname, string outputFname, string inputEsiStr,
              string outputEsiStr)
{
    int status = 0;

    RqInterWorkMem* interWork = NULL;
    RqInterProgram* interProgram = NULL;
    RqOutWorkMem*   outWork = NULL;
    RqOutProgram*   outProgram = NULL;

    /* Open input and output files */
    ifstream ifs(inputFname, ios::binary|ios::ate);
    int length = ifs.tellg();
    ifs.seekg(0, ios::beg);

    ofstream ofs(outputFname, ios::binary);

#define DONE()                                                  \
    do {                                                        \
        if (interProgram)    free(interProgram);                \
        if (interWork)       free(interWork);                   \
        if (outWork)         free(outWork);                     \
        if (outProgram)      free(outProgram);                  \
        ifs.close();                                            \
        ofs.close();                                            \
        if (status == 0) return true; else return false;        \
    } while(0);
#define RUN_NOFAIL(x)   RUN_NOFAIL__INT(x, RUN_NOFAIL__err)
#define RUN_NOFAIL__INT(x,           err)                       \
    do {                                                        \
        int err;                                                \
        if ((err = (x)) != 0) {                                 \
            fprintf(stderr, "Error:%s:%d:  %s failed: %d\n",    \
                    __FILE__, __LINE__, #x, err);               \
            status = err;                                       \
            DONE();                                             \
        }                                                       \
    } while(0)

    if (!ifs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open input file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    if (!ofs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open output file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    /* Setup src block */
    int inputEsiCnt = getESICnt(inputEsiStr);
    uint8_t src[inputEsiCnt * symSize];

    uint32_t ESIs_input[inputEsiCnt];
    parseESIStr(inputEsiStr, inputEsiCnt, ESIs_input);

    size_t interWorkSize, interProgSize, iblockSymCnt;

    /* Get various memory sizes from RQ API */
    const int nExtra = inputEsiCnt - K;
    RUN_NOFAIL(RqInterGetMemSizes(K,
                                nExtra,
                                &interWorkSize,
                                &interProgSize,
                                &iblockSymCnt));

    /* Create encoding interProgram */
    interWork = (RqInterWorkMem* )malloc(interWorkSize);
    RUN_NOFAIL(RqInterInit(K, nExtra, interWork, interWorkSize));
    for (int i = 0; i < inputEsiCnt; ++i) {
        RqInterAddIds(interWork, ESIs_input[i], 1);
    }

    interProgram = (RqInterProgram*)malloc(interProgSize);
    RUN_NOFAIL(RqInterCompile(interWork, interProgram, interProgSize));

    /* Setup enc block */
    int outputEsiCnt = getESICnt(outputEsiStr);
    uint32_t ESIs_wanted[outputEsiCnt];

    parseESIStr(outputEsiStr, outputEsiCnt, ESIs_wanted);
    uint8_t enc[outputEsiCnt * symSize];

    /* Create encoding output symbol Program */
    size_t outWorkSize, outProgSize;
    RUN_NOFAIL(RqOutGetMemSizes(outputEsiCnt, &outWorkSize, &outProgSize));
    outWork = (RqOutWorkMem*) malloc(outWorkSize);
    outProgram = (RqOutProgram*) malloc(outProgSize);
    RUN_NOFAIL(RqOutInit(K, outWork, outWorkSize));
    for (int i = 0; i < outputEsiCnt; ++i)
        RUN_NOFAIL(RqOutAddIds(outWork, ESIs_wanted[i], 1));
    RUN_NOFAIL(RqOutCompile(outWork, outProgram, outProgSize));

    /* Iterate through the input file and transcode the data */
    int count =  0;
    while (count < length) {
        for (int i = 0; i < inputEsiCnt * symSize; ++i) {
            src[i] = 0x00;
        }

        ifs.read((char*)src, inputEsiCnt * symSize);
        if (!ifs) {
            fprintf(stderr, "Error: %s:%d: Unable to read enough bytes from file: %ld\n",
                    __FILE__, __LINE__, ifs.gcount());

            status = 1;
            DONE();
        }

        count += inputEsiCnt * symSize;

        /* Create intermediate block */
        uint8_t iblock[iblockSymCnt * symSize];
        RUN_NOFAIL(RqInterExecute(interProgram,         // interProgram
				  symSize,            // symbol size
				  src,                // symbol data
				  sizeof(src),        // sizeof symbol data
				  iblock,             // i-block
				  sizeof(iblock))); // size thereof

        /* Compute encoding/decoding */
        memset(enc, 0, sizeof(enc));
        RUN_NOFAIL(RqOutExecute(outProgram,
                                    symSize,
                                    iblock,
                                    enc,
                                    sizeof(enc)));

        /* End of transcode */

        /* Write out data to output file */
        ofs.write ((char*)(&enc[0]), sizeof(enc));
        if (!ofs.good() ) {
            fprintf(stderr,  "Error:%s:%d: Error while writing to output file\n",
                    __FILE__, __LINE__);

            status = 1;
            DONE();
        }
    }

    DONE();
#undef RUN_NOFAIL__INT
#undef RUN_NOFAIL
#undef DONE
}